

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermediate_code.cpp
# Opt level: O2

void __thiscall
CJUMP::CJUMP(CJUMP *this,int relop,ExprNode *left,ExprNode *right,Label *ifTrue,Label *ifFalse)

{
  (this->super_StmNode).super_ICTNode._vptr_ICTNode = (_func_int **)&PTR__CJUMP_001246c0;
  *(int *)&(this->super_StmNode).field_0xc = relop;
  this->left = left;
  this->right = right;
  this->ifTrue = ifTrue;
  this->ifFalse = ifFalse;
  (this->super_StmNode).typeStm = 0xb;
  return;
}

Assistant:

CJUMP::CJUMP(int relop, ExprNode *left, ExprNode *right, Label *ifTrue, Label *ifFalse) {
    this->relop = relop;
    this->left = left;
    this->right = right;
    this->ifTrue = ifTrue;
    this->ifFalse = ifFalse;
    this->setTypeStm(V_CJUMP);

}